

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O0

bool __thiscall internalJSONNode::operator_cast_to_bool(internalJSONNode *this)

{
  uchar uVar1;
  bool bVar2;
  json_string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  json_number local_20;
  internalJSONNode *local_18;
  internalJSONNode *this_local;
  
  local_18 = this;
  Fetch(this);
  uVar1 = type(this);
  if (uVar1 == '\0') {
    this_local._7_1_ = false;
  }
  else if (uVar1 == '\x02') {
    local_20 = 0.0;
    bVar2 = _floatsAreEqual(&(this->_value)._number,&local_20);
    this_local._7_1_ = (bool)((bVar2 ^ 0xffU) & 1);
  }
  else {
    uVar1 = type(this);
    __lhs = jsonSingletonERROR_UNDEFINED::getValue_abi_cxx11_();
    std::operator+(&local_40,__lhs,"(bool)");
    JSONDebug::_JSON_ASSERT(uVar1 == '\x03',&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    this_local._7_1_ = (bool)((this->_value)._bool & 1);
  }
  return this_local._7_1_;
}

Assistant:

internalJSONNode::operator bool() const json_nothrow {
    Fetch();
    #ifdef JSON_CASTABLE /*-> JSON_CASTABLE */
	   switch(type()){
		  case JSON_NUMBER:
			 return !_floatsAreEqual(_value._number, (json_number)0.0);
		  case JSON_NULL:
			 return false;
	   }
    #endif /*<- */
    JSON_ASSERT(type() == JSON_BOOL, json_global(ERROR_UNDEFINED) + JSON_TEXT("(bool)"));
    return _value._bool;
}